

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaLinCon.cpp
# Opt level: O0

void __thiscall NaLinearUnitsChain::Function(NaLinearUnitsChain *this)

{
  NaReal *in_stack_00000040;
  NaReal *in_stack_00000048;
  NaLinearUnitsChain *in_stack_00000050;
  
  Function(in_stack_00000050,in_stack_00000048,in_stack_00000040);
  return;
}

Assistant:

void    NaLinearUnitsChain::Function (NaReal* x, NaReal* y)
{
    if(NULL == x || NULL == y)
        throw(na_null_pointer);

    int i;

    // Chain function computation
    memcpy(iobuf[0], x, sizeof(NaReal) * InputDim());
    for(i = 0; i < count(); ++i){
        fetch(i).Function(iobuf[i%2], iobuf[(i + 1)%2]);
    }
    memcpy(y, iobuf[i%2], sizeof(NaReal) * OutputDim());
}